

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O3

int csp_zmqhub_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  void *pvVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  
  pvVar1 = iface->driver_data;
  csp_id_prepend(packet);
  pthread_mutex_lock((pthread_mutex_t *)&lock);
  uVar2 = zmq_send(*(undefined8 *)((long)pvVar1 + 0x10),(packet->field_0).field_1.frame_begin,
                   (packet->field_0).field_1.frame_length,0);
  pthread_mutex_unlock((pthread_mutex_t *)&lock);
  if ((int)uVar2 < 0) {
    uVar3 = zmq_errno();
    uVar4 = zmq_strerror(uVar3);
    csp_print_func("ZMQ send error: %u %s\n",(ulong)uVar2,uVar4);
  }
  csp_buffer_free(packet);
  return 0;
}

Assistant:

int csp_zmqhub_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	zmq_driver_t * drv = iface->driver_data;

	csp_id_prepend(packet);

	/** 
	 * While a ZMQ context is thread safe, sockets are NOT threadsafe, so by sharing drv->publisher, we 
	 * need to have a lock around any calls that uses that */
	pthread_mutex_lock(&lock);
	int result = zmq_send(drv->publisher, packet->frame_begin, packet->frame_length, 0);
	pthread_mutex_unlock(&lock);

	if (result < 0) {
		csp_print("ZMQ send error: %u %s\n", result, zmq_strerror(zmq_errno()));
	}

	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}